

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

void BlockStream_Close(TBlockStream *pStream)

{
  TBlockStream *pStream_local;
  
  if (pStream->FileBitmap != (void *)0x0) {
    free(pStream->FileBitmap);
  }
  pStream->FileBitmap = (void *)0x0;
  (*(pStream->super_TFileStream).BaseClose)(&pStream->super_TFileStream);
  return;
}

Assistant:

static void BlockStream_Close(TBlockStream * pStream)
{
    // Free the data map, if any
    if(pStream->FileBitmap != NULL)
        CASC_FREE(pStream->FileBitmap);
    pStream->FileBitmap = NULL;

    // Call the base class for closing the stream
    pStream->BaseClose(pStream);
}